

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::CopyPchCompilePdb
          (cmLocalGenerator *this,string *config,cmGeneratorTarget *target,string *ReuseFrom,
          cmGeneratorTarget *reuseTarget,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *extensions)

{
  cmTarget *this_00;
  string_view expr;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  undefined8 this_01;
  bool bVar1;
  uint uVar2;
  cmGlobalGenerator *pcVar3;
  cmLocalGenerator *pcVar4;
  string *psVar5;
  ostream *poVar6;
  ulong uVar7;
  pointer pcVar8;
  cmSourceFile *this_02;
  allocator<char> local_9c1;
  string local_9c0;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_9a0;
  cmSourceFile *local_998;
  cmSourceFile *copy_rule;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_978;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_970;
  cmCustomCommandLines local_958;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_940;
  __single_object cc;
  cmAlphaNum local_908;
  string local_8d8;
  string_view local_8b8;
  string local_8a8;
  undefined1 local_888 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  char *no_message;
  string local_858;
  string_view local_838;
  string local_828;
  cmAlphaNum local_808;
  cmAlphaNum local_7d8;
  string local_7a8;
  string_view local_788;
  string local_778;
  string_view local_758;
  string local_748;
  basic_string_view<char,_std::char_traits<char>_> local_728;
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  iterator local_6e8;
  undefined8 local_6e0;
  undefined1 local_6d8 [8];
  cmCustomCommandLines commandLines;
  anon_class_16_2_381a533d configGenex;
  cmAlphaNum local_680;
  string local_650;
  allocator<char> local_629;
  string local_628;
  string *local_608;
  string *prefix;
  string dest_file;
  cmAlphaNum local_5b0;
  undefined1 local_580 [8];
  string to_file;
  cmAlphaNum local_530;
  undefined1 local_500 [8];
  string to_dir;
  cmAlphaNum local_4b0;
  undefined1 local_480 [8];
  string from_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extension;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmGeneratedFileStream file;
  cmAlphaNum local_1d0;
  cmAlphaNum local_1a0;
  undefined1 local_170 [8];
  string copy_script;
  cmAlphaNum local_120;
  undefined1 local_f0 [8];
  string target_compile_pdb_dir;
  allocator<char> local_b9;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  undefined1 local_58 [8];
  string pdb_prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extensions_local;
  cmGeneratorTarget *reuseTarget_local;
  string *ReuseFrom_local;
  cmGeneratorTarget *target_local;
  string *config_local;
  cmLocalGenerator *this_local;
  
  pdb_prefix.field_2._8_8_ = extensions;
  pcVar3 = GetGlobalGenerator(this);
  uVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x26])();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"",&local_b9);
    std::allocator<char>::~allocator(&local_b9);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_88,config);
    cmAlphaNum::cmAlphaNum(&local_b8,"/");
    cmStrCat<>((string *)local_58,&local_88,&local_b8);
  }
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
  psVar5 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
  cmAlphaNum::cmAlphaNum(&local_120,psVar5);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&copy_script.field_2 + 8),"/");
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  cmStrCat<std::__cxx11::string,char[6]>
            ((string *)local_f0,&local_120,(cmAlphaNum *)((long)&copy_script.field_2 + 8),psVar5,
             (char (*) [6])0xdec9df);
  cmAlphaNum::cmAlphaNum(&local_1a0,(string *)local_f0);
  cmAlphaNum::cmAlphaNum(&local_1d0,"copy_idb_pdb_");
  file._608_8_ = std::__cxx11::string::c_str();
  cmStrCat<char_const*,char[7]>
            ((string *)local_170,&local_1a0,&local_1d0,(char **)&file.field_0x260,
             (char (*) [7])0xdbab91);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&__range1,(string *)local_170,false,None);
  std::operator<<((ostream *)&__range1,"# CMake generated file\n");
  poVar6 = std::operator<<((ostream *)&__range1,
                           "# The compiler generated pdb file needs to be written to disk\n");
  poVar6 = std::operator<<(poVar6,"# by mspdbsrv. The foreach retry loop is needed to make sure\n");
  std::operator<<(poVar6,"# the pdb file is ready to be copied.\n\n");
  this_01 = pdb_prefix.field_2._8_8_;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pdb_prefix.field_2._8_8_);
  extension = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&extension), bVar1) {
    from_file.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(reuseTarget);
    psVar5 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    cmAlphaNum::cmAlphaNum(&local_4b0,psVar5);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&to_dir.field_2 + 8),"/");
    cmStrCat<std::__cxx11::string,char[19],std::__cxx11::string,std::__cxx11::string>
              ((string *)local_480,&local_4b0,(cmAlphaNum *)((long)&to_dir.field_2 + 8),ReuseFrom,
               (char (*) [19])".dir/${PDB_PREFIX}",ReuseFrom,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               from_file.field_2._8_8_);
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
    psVar5 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    cmAlphaNum::cmAlphaNum(&local_530,psVar5);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&to_file.field_2 + 8),"/");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    cmStrCat<std::__cxx11::string,char[19]>
              ((string *)local_500,&local_530,(cmAlphaNum *)((long)&to_file.field_2 + 8),psVar5,
               (char (*) [19])".dir/${PDB_PREFIX}");
    cmAlphaNum::cmAlphaNum(&local_5b0,(string *)local_500);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&dest_file.field_2 + 8),ReuseFrom);
    cmStrCat<std::__cxx11::string>
              ((string *)local_580,&local_5b0,(cmAlphaNum *)((long)&dest_file.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               from_file.field_2._8_8_);
    std::__cxx11::string::string((string *)&prefix,(string *)local_580);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"PREFIX",&local_629);
    psVar5 = cmGeneratorTarget::GetSafeProperty(target,&local_628);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator(&local_629);
    local_608 = psVar5;
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_680,(string *)local_500);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&configGenex.config,local_608);
      cmStrCat<std::__cxx11::string,std::__cxx11::string>
                (&local_650,&local_680,(cmAlphaNum *)&configGenex.config,ReuseFrom,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 from_file.field_2._8_8_);
      std::__cxx11::string::operator=((string *)&prefix,(string *)&local_650);
      std::__cxx11::string::~string((string *)&local_650);
    }
    std::operator<<((ostream *)&__range1,"foreach(retry RANGE 1 30)\n");
    poVar6 = std::operator<<((ostream *)&__range1,"  if (EXISTS \"");
    poVar6 = std::operator<<(poVar6,(string *)local_480);
    poVar6 = std::operator<<(poVar6,"\" AND (NOT EXISTS \"");
    poVar6 = std::operator<<(poVar6,(string *)&prefix);
    poVar6 = std::operator<<(poVar6,"\" OR NOT \"");
    poVar6 = std::operator<<(poVar6,(string *)&prefix);
    poVar6 = std::operator<<(poVar6,"  \" IS_NEWER_THAN \"");
    poVar6 = std::operator<<(poVar6,(string *)local_480);
    std::operator<<(poVar6,"\"))\n");
    std::operator<<((ostream *)&__range1,"    execute_process(COMMAND ${CMAKE_COMMAND} -E copy");
    poVar6 = std::operator<<((ostream *)&__range1," \"");
    poVar6 = std::operator<<(poVar6,(string *)local_480);
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6," \"");
    poVar6 = std::operator<<(poVar6,(string *)local_500);
    poVar6 = std::operator<<(poVar6,"\" RESULT_VARIABLE result ");
    std::operator<<(poVar6," ERROR_QUIET)\n");
    poVar6 = std::operator<<((ostream *)&__range1,"    if (NOT result EQUAL 0)\n");
    poVar6 = std::operator<<(poVar6,"      execute_process(COMMAND ${CMAKE_COMMAND}");
    poVar6 = std::operator<<(poVar6," -E sleep 1)\n");
    std::operator<<(poVar6,"    else()\n");
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&__range1,"  file(REMOVE \"");
      poVar6 = std::operator<<(poVar6,(string *)&prefix);
      std::operator<<(poVar6,"\")\n");
      poVar6 = std::operator<<((ostream *)&__range1,"  file(RENAME \"");
      poVar6 = std::operator<<(poVar6,(string *)local_580);
      poVar6 = std::operator<<(poVar6,"\" \"");
      poVar6 = std::operator<<(poVar6,(string *)&prefix);
      std::operator<<(poVar6,"\")\n");
    }
    poVar6 = std::operator<<((ostream *)&__range1,"      break()\n");
    std::operator<<(poVar6,"    endif()\n");
    poVar6 = std::operator<<((ostream *)&__range1,"  elseif(NOT EXISTS \"");
    poVar6 = std::operator<<(poVar6,(string *)local_480);
    poVar6 = std::operator<<(poVar6,"\")\n");
    poVar6 = std::operator<<(poVar6,"    execute_process(COMMAND ${CMAKE_COMMAND}");
    poVar6 = std::operator<<(poVar6," -E sleep 1)\n");
    std::operator<<(poVar6,"  endif()\n");
    std::operator<<((ostream *)&__range1,"endforeach()\n");
    std::__cxx11::string::~string((string *)&prefix);
    std::__cxx11::string::~string((string *)local_580);
    std::__cxx11::string::~string((string *)local_500);
    std::__cxx11::string::~string((string *)local_480);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  configGenex.this = (cmLocalGenerator *)config;
  psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  local_758 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
  CopyPchCompilePdb(std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const
            (&local_748,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_758);
  local_728 = (basic_string_view<char,_std::char_traits<char>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_748);
  cmAlphaNum::cmAlphaNum(&local_7d8,"-DPDB_PREFIX=");
  cmAlphaNum::cmAlphaNum(&local_808,(string *)local_58);
  cmStrCat<>(&local_7a8,&local_7d8,&local_808);
  local_788 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_7a8);
  CopyPchCompilePdb(std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const
            (&local_778,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_788);
  local_718 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_778);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_838,"-P");
  CopyPchCompilePdb(std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const
            (&local_828,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_838);
  local_708 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_828);
  expr = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_170);
  CopyPchCompilePdb(std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const
            (&local_858,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,expr);
  local_6f8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_858);
  local_6e8 = &local_728;
  local_6e0 = 4;
  ilist._M_len = 4;
  ilist._M_array = local_6e8;
  cmMakeSingleCommandLine((cmCustomCommandLines *)local_6d8,ilist);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_748);
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xe2f737;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_888);
  cmAlphaNum::cmAlphaNum(&local_908,(string *)local_f0);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&cc,(string *)local_58);
  cmStrCat<std::__cxx11::string,char[5]>
            (&local_8d8,&local_908,(cmAlphaNum *)&cc,ReuseFrom,(char (*) [5])".pdb");
  local_8b8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_8d8);
  CopyPchCompilePdb(std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const
            (&local_8a8,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_8b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_888,&local_8a8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::make_unique<cmCustomCommand>();
  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                     (&local_940);
  cmCustomCommandLines::cmCustomCommandLines(&local_958,(cmCustomCommandLines *)local_6d8);
  cmCustomCommand::SetCommandLines(pcVar8,&local_958);
  cmCustomCommandLines::~cmCustomCommandLines(&local_958);
  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                     (&local_940);
  cmCustomCommand::SetComment
            (pcVar8,(char *)outputs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                     (&local_940);
  cmCustomCommand::SetCMP0116Status(pcVar8,NEW);
  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                     (&local_940);
  cmCustomCommand::SetStdPipesUTF8(pcVar8,true);
  pcVar3 = GetGlobalGenerator(this);
  uVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x28])();
  if ((uVar2 & 1) == 0) {
    pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       (&local_940);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&copy_rule,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_888);
    cmCustomCommand::SetOutputs
              (pcVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&copy_rule);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&copy_rule);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              (&local_9a0,&local_940);
    this_02 = AddCustomCommandToOutput(this,&local_9a0,false);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_9a0)
    ;
    local_998 = this_02;
    if (this_02 != (cmSourceFile *)0x0) {
      psVar5 = cmSourceFile::ResolveFullPath(this_02,(string *)0x0,(string *)0x0);
      cmGeneratorTarget::AddSource(target,psVar5,false);
    }
  }
  else {
    pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       (&local_940);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_970,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_888);
    cmCustomCommand::SetByproducts(pcVar8,&local_970);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_970);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              (&local_978,&local_940);
    AddCustomCommandToTarget(this,psVar5,PRE_BUILD,&local_978,Accept);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_978)
    ;
  }
  this_00 = target->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c0,"COMPILE_PDB_OUTPUT_DIRECTORY",&local_9c1);
  cmTarget::SetProperty(this_00,&local_9c0,(string *)local_f0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::allocator<char>::~allocator(&local_9c1);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_940);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_888);
  cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)local_6d8);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range1);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void cmLocalGenerator::CopyPchCompilePdb(
  const std::string& config, cmGeneratorTarget* target,
  const std::string& ReuseFrom, cmGeneratorTarget* reuseTarget,
  const std::vector<std::string>& extensions)
{
  const std::string pdb_prefix =
    this->GetGlobalGenerator()->IsMultiConfig() ? cmStrCat(config, "/") : "";

  const std::string target_compile_pdb_dir =
    cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
             target->GetName(), ".dir/");

  const std::string copy_script = cmStrCat(
    target_compile_pdb_dir, "copy_idb_pdb_", config.c_str(), ".cmake");
  cmGeneratedFileStream file(copy_script);

  file << "# CMake generated file\n";

  file << "# The compiler generated pdb file needs to be written to disk\n"
       << "# by mspdbsrv. The foreach retry loop is needed to make sure\n"
       << "# the pdb file is ready to be copied.\n\n";

  for (auto const& extension : extensions) {
    const std::string from_file =
      cmStrCat(reuseTarget->GetLocalGenerator()->GetCurrentBinaryDirectory(),
               "/", ReuseFrom, ".dir/${PDB_PREFIX}", ReuseFrom, extension);

    const std::string to_dir =
      cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
               target->GetName(), ".dir/${PDB_PREFIX}");

    const std::string to_file = cmStrCat(to_dir, ReuseFrom, extension);

    std::string dest_file = to_file;

    std::string const& prefix = target->GetSafeProperty("PREFIX");
    if (!prefix.empty()) {
      dest_file = cmStrCat(to_dir, prefix, ReuseFrom, extension);
    }

    file << "foreach(retry RANGE 1 30)\n";
    file << "  if (EXISTS \"" << from_file << "\" AND (NOT EXISTS \""
         << dest_file << "\" OR NOT \"" << dest_file << "  \" IS_NEWER_THAN \""
         << from_file << "\"))\n";
    file << "    execute_process(COMMAND ${CMAKE_COMMAND} -E copy";
    file << " \"" << from_file << "\""
         << " \"" << to_dir << "\" RESULT_VARIABLE result "
         << " ERROR_QUIET)\n";
    file << "    if (NOT result EQUAL 0)\n"
         << "      execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "    else()\n";
    if (!prefix.empty()) {
      file << "  file(REMOVE \"" << dest_file << "\")\n";
      file << "  file(RENAME \"" << to_file << "\" \"" << dest_file << "\")\n";
    }
    file << "      break()\n"
         << "    endif()\n";
    file << "  elseif(NOT EXISTS \"" << from_file << "\")\n"
         << "    execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "  endif()\n";
    file << "endforeach()\n";
  }

  auto configGenex = [&](cm::string_view expr) -> std::string {
    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      return cmStrCat("$<$<CONFIG:", config, ">:", expr, ">");
    }
    return std::string(expr);
  };

  cmCustomCommandLines commandLines = cmMakeSingleCommandLine(
    { configGenex(cmSystemTools::GetCMakeCommand()),
      configGenex(cmStrCat("-DPDB_PREFIX=", pdb_prefix)), configGenex("-P"),
      configGenex(copy_script) });

  const char* no_message = "";

  std::vector<std::string> outputs;
  outputs.push_back(configGenex(
    cmStrCat(target_compile_pdb_dir, pdb_prefix, ReuseFrom, ".pdb")));

  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetCommandLines(commandLines);
  cc->SetComment(no_message);
  cc->SetCMP0116Status(cmPolicies::NEW);
  cc->SetStdPipesUTF8(true);

  if (this->GetGlobalGenerator()->IsVisualStudio()) {
    cc->SetByproducts(outputs);
    this->AddCustomCommandToTarget(
      target->GetName(), cmCustomCommandType::PRE_BUILD, std::move(cc),
      cmObjectLibraryCommands::Accept);
  } else {
    cc->SetOutputs(outputs);
    cmSourceFile* copy_rule = this->AddCustomCommandToOutput(std::move(cc));

    if (copy_rule) {
      target->AddSource(copy_rule->ResolveFullPath());
    }
  }

  target->Target->SetProperty("COMPILE_PDB_OUTPUT_DIRECTORY",
                              target_compile_pdb_dir);
}